

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManPrintNpnClasses(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char **ppcVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *vVisited;
  Vec_Int_t *vTruth;
  void *__ptr;
  long lVar6;
  uint *puVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  double dVar21;
  int ClassCounts [222];
  uint local_3a8 [222];
  
  ppcVar4 = Kit_DsdNpn4ClassNames();
  memset(local_3a8,0,0x378);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMan.c"
                  ,0x2b1,"void Gia_ManPrintNpnClasses(Gia_Man_t *)");
  }
  iVar3 = Gia_ManLutSizeMax(p);
  if (4 < iVar3) {
    __assert_fail("Gia_ManLutSizeMax( p ) <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMan.c"
                  ,0x2b2,"void Gia_ManPrintNpnClasses(Gia_Man_t *)");
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  vVisited = (Vec_Int_t *)malloc(0x10);
  vVisited->nCap = 100;
  vVisited->nSize = 0;
  piVar5 = (int *)malloc(400);
  vVisited->pArray = piVar5;
  vTruth = (Vec_Int_t *)malloc(0x10);
  vTruth->nCap = 0x10000;
  vTruth->nSize = 0;
  piVar5 = (int *)malloc(0x40000);
  vTruth->pArray = piVar5;
  __ptr = calloc((long)p->nObjs,4);
  Gia_ManCleanTruth(p);
  if (1 < p->nObjs) {
    lVar16 = 1;
    do {
      iVar3 = p->vMapping->nSize;
      if (iVar3 <= lVar16) goto LAB_006e883d;
      piVar5 = p->vMapping->pArray;
      uVar14 = piVar5[lVar16];
      if ((ulong)uVar14 != 0) {
        if (((int)uVar14 < 0) || (iVar3 <= (int)uVar14)) goto LAB_006e883d;
        if (piVar5[uVar14] < 5) {
          p_00->nSize = 0;
          pVVar8 = p->vMapping;
          lVar6 = (long)pVVar8->nSize;
          if (lVar6 <= lVar16) goto LAB_006e883d;
          iVar3 = 4;
          uVar19 = 0;
          while( true ) {
            piVar5 = pVVar8->pArray;
            lVar10 = (long)piVar5[lVar16];
            if ((lVar10 < 0) || ((int)lVar6 <= piVar5[lVar16])) goto LAB_006e883d;
            if ((long)piVar5[lVar10] <= (long)uVar19) break;
            Vec_IntPush(p_00,piVar5[lVar10 + uVar19 + 1]);
            uVar19 = uVar19 + 1;
            pVVar8 = p->vMapping;
            lVar6 = (long)pVVar8->nSize;
            iVar3 = iVar3 + -1;
            if (lVar6 <= lVar16) goto LAB_006e883d;
          }
          if (uVar19 < 4) {
            do {
              Vec_IntPush(p_00,0);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          if (p->nObjs <= lVar16) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          puVar7 = Gia_ManConvertAigToTruth(p,p->pObjs + lVar16,p_00,vTruth,vVisited);
          iVar3 = Dar_LibReturnClass(*puVar7);
          local_3a8[iVar3] = local_3a8[iVar3] + 1;
          *(int *)((long)__ptr + lVar16 * 4) = iVar3;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < p->nObjs);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (vTruth->pArray != (int *)0x0) {
    free(vTruth->pArray);
    vTruth->pArray = (int *)0x0;
  }
  free(vTruth);
  if (vVisited->pArray != (int *)0x0) {
    free(vVisited->pArray);
    vVisited->pArray = (int *)0x0;
  }
  free(vVisited);
  if (p->vTruths != (Vec_Int_t *)0x0) {
    piVar5 = p->vTruths->pArray;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->vTruths->pArray = (int *)0x0;
    }
    vVisited = p->vTruths;
    if (vVisited != (Vec_Int_t *)0x0) {
      free(vVisited);
      p->vTruths = (Vec_Int_t *)0x0;
    }
  }
  lVar16 = 0;
  uVar14 = 0;
  do {
    uVar14 = uVar14 + local_3a8[lVar16];
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0xde);
  uVar19 = 0;
  Abc_Print((int)vVisited,"NPN CLASS STATISTICS (for %d LUT4 present in the current mapping):\n",
            (ulong)uVar14);
  dVar21 = (double)(int)(uVar14 + 1);
  iVar3 = 0;
  do {
    uVar18 = local_3a8[uVar19];
    if (uVar18 != 0) {
      iVar3 = iVar3 + uVar18;
      Abc_Print((int)vVisited,"Class %3d :  Count = %6d   (%7.2f %%)   %s\n",
                ((double)(int)uVar18 * 100.0) / dVar21,uVar19 & 0xffffffff,(ulong)uVar18,
                ppcVar4[uVar19]);
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0xde);
  Abc_Print((int)vVisited,"Other     :  Count = %6d   (%7.2f %%)\n",
            ((double)(int)(uVar14 - iVar3) * 100.0) / dVar21,(ulong)(uVar14 - iVar3));
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManSetRefsMapped(p);
  uVar18 = 0;
  uVar14 = 0;
  if (1 < (long)p->nObjs) {
    uVar1 = p->vMapping->nSize;
    uVar19 = 1;
    if (1 < (int)uVar1) {
      uVar19 = (ulong)uVar1;
    }
    uVar14 = 0;
    uVar11 = 1;
    uVar18 = 0;
    do {
      if (uVar11 == uVar19) {
LAB_006e883d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = p->vMapping->pArray;
      uVar2 = piVar5[uVar11];
      if (((ulong)uVar2 != 0) && (*(int *)((long)__ptr + uVar11 * 4) == 0x6d)) {
        if ((int)uVar1 <= (int)uVar2 || (int)uVar2 < 0) goto LAB_006e883d;
        puVar7 = (uint *)(piVar5 + uVar2);
        uVar15 = *puVar7;
        uVar13 = 0;
        uVar12 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar12 = uVar13;
        }
        uVar15 = 0;
        uVar17 = 0;
        while (uVar12 != uVar13) {
          lVar16 = (long)(int)puVar7[uVar13 + 1];
          uVar9 = 0;
          bVar20 = *(int *)((long)__ptr + lVar16 * 4) == 0x6d;
          if (bVar20) {
            uVar9 = (uint)(p->pRefs[lVar16] == 1);
          }
          uVar17 = uVar17 + bVar20;
          uVar15 = uVar15 + uVar9;
          uVar13 = uVar13 + 1;
          if ((int)uVar1 <= (int)uVar2 || (int)uVar2 < 0) goto LAB_006e883d;
        }
        uVar18 = (uVar18 + 1) - (uint)(uVar17 < 2);
        uVar14 = (uVar14 + 1) - (uint)(uVar15 < 2);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (long)p->nObjs);
  }
  piVar5 = p->pRefs;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    p->pRefs = (int *)0x0;
  }
  Abc_Print((int)piVar5,
            "Approximate number of 4:1 MUX structures: All = %6d  (%7.2f %%)  MFFC = %6d  (%7.2f %%)\n"
            ,((double)(int)uVar18 * 100.0) / dVar21,((double)(int)uVar14 * 100.0) / dVar21,
            (ulong)uVar18,(ulong)uVar14);
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManPrintNpnClasses( Gia_Man_t * p )
{
    extern char ** Kit_DsdNpn4ClassNames();
    char ** pNames = Kit_DsdNpn4ClassNames();
    Vec_Int_t * vLeaves, * vTruth, * vVisited;
    int * pLutClass, ClassCounts[222] = {0};
    int i, k, iFan, Class, OtherClasses, OtherClasses2, nTotal, Counter, Counter2;
    unsigned * pTruth;
    assert( Gia_ManHasMapping(p) );
    assert(  Gia_ManLutSizeMax( p ) <= 4 );
    vLeaves   = Vec_IntAlloc( 100 );
    vVisited  = Vec_IntAlloc( 100 );
    vTruth    = Vec_IntAlloc( (1<<16) );
    pLutClass = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManCleanTruth( p );
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutSize(p,i) > 4 )
            continue;
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, i, iFan, k )
            Vec_IntPush( vLeaves, iFan );
        for ( ; k < 4; k++ )
            Vec_IntPush( vLeaves, 0 );
        pTruth = Gia_ManConvertAigToTruth( p, Gia_ManObj(p, i), vLeaves, vTruth, vVisited );
        Class = Dar_LibReturnClass( *pTruth );
        ClassCounts[ Class ]++;
        pLutClass[i] = Class;
    }
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    Vec_IntFreeP( &p->vTruths );
    nTotal = 0;
    for ( i = 0; i < 222; i++ )
        nTotal += ClassCounts[i];
    Abc_Print( 1, "NPN CLASS STATISTICS (for %d LUT4 present in the current mapping):\n", nTotal );
    OtherClasses = 0;
    for ( i = 0; i < 222; i++ )
    {
        if ( ClassCounts[i] == 0 )
            continue;
//        if ( 100.0 * ClassCounts[i] / (nTotal+1) < 0.1 ) // do not show anything below 0.1 percent
//            continue;
        OtherClasses += ClassCounts[i];
        Abc_Print( 1, "Class %3d :  Count = %6d   (%7.2f %%)   %s\n", 
            i, ClassCounts[i], 100.0 * ClassCounts[i] / (nTotal+1), pNames[i] );
    }
    OtherClasses = nTotal - OtherClasses;
    Abc_Print( 1, "Other     :  Count = %6d   (%7.2f %%)\n", 
        OtherClasses, 100.0 * OtherClasses / (nTotal+1) );
    // count the number of LUTs that have MUX function and two fanins with MUX functions
    OtherClasses = OtherClasses2 = 0;
    ABC_FREE( p->pRefs );
    Gia_ManSetRefsMapped( p );
    Gia_ManForEachLut( p, i )
    {
        if ( pLutClass[i] != 109 )
            continue;
        Counter = Counter2 = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
        {
            Counter  += (pLutClass[iFan] == 109);
            Counter2 += (pLutClass[iFan] == 109) && (Gia_ObjRefNumId(p, iFan) == 1);
        }
        OtherClasses  += (Counter > 1);
        OtherClasses2 += (Counter2 > 1);
//            Abc_Print( 1, "%d -- ", pLutClass[i] );
//            Gia_LutForEachFanin( p, i, iFan, k )
//                Abc_Print( 1, "%d ", pLutClass[iFan] );
//            Abc_Print( 1, "\n" );
    }
    ABC_FREE( p->pRefs );
    Abc_Print( 1, "Approximate number of 4:1 MUX structures: All = %6d  (%7.2f %%)  MFFC = %6d  (%7.2f %%)\n", 
        OtherClasses,  100.0 * OtherClasses  / (nTotal+1),
        OtherClasses2, 100.0 * OtherClasses2 / (nTotal+1) );
    ABC_FREE( pLutClass );
}